

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_list.cpp
# Opt level: O2

void __thiscall libtorrent::aux::tracker_list::prioritize_udp_trackers(tracker_list *this)

{
  trackers_t *p;
  node_ptr plVar1;
  node_ptr plVar2;
  bool bVar3;
  node_ptr next;
  node_ptr to_erase_1;
  node_ptr plVar4;
  error_code *in_R8;
  node_ptr to_erase;
  header_holder_type *phVar5;
  node_ptr plVar6;
  string_view url;
  string_view url_00;
  error_code ec;
  undefined1 local_108 [16];
  string udp_hostname;
  string hostname;
  undefined1 local_b8 [136];
  
  p = &this->m_trackers;
  phVar5 = &(this->m_trackers).super_type.data_.root_plus_size_.m_header;
  plVar6 = &phVar5->super_node;
  do {
    do {
      plVar1 = ((node *)&plVar6->next_)->next_;
      if (plVar1 == &phVar5->super_node) {
        return;
      }
      ::std::__cxx11::string::substr((ulong)local_b8,(ulong)(plVar1 + 1));
      bVar3 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"udp://");
      ::std::__cxx11::string::~string((string *)local_b8);
      plVar6 = plVar1;
    } while (bVar3);
    ec.val_ = 0;
    ec.failed_ = false;
    udp_hostname._M_dataplus._M_p = (pointer)&udp_hostname.field_2;
    udp_hostname._M_string_length = 0;
    ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
               super_error_category;
    udp_hostname.field_2._M_local_buf[0] = '\0';
    url._M_str = (char *)&ec;
    url._M_len = (size_t)plVar1[1].next_;
    parse_url_components_abi_cxx11_
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,(aux *)plVar1[1].prev_,url,in_R8);
    ::std::__cxx11::string::operator=((string *)&udp_hostname,(string *)(local_b8 + 0x28));
    ::std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8);
    plVar4 = &phVar5->super_node;
    while (plVar4 = plVar4->next_, plVar4 != plVar1) {
      ::std::__cxx11::string::substr((ulong)local_b8,(ulong)(plVar4 + 1));
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"udp://");
      ::std::__cxx11::string::~string((string *)local_b8);
      if (!bVar3) {
        hostname._M_dataplus._M_p = (pointer)&hostname.field_2;
        hostname._M_string_length = 0;
        hostname.field_2._M_local_buf[0] = '\0';
        url_00._M_str = (char *)&ec;
        url_00._M_len = (size_t)plVar4[1].next_;
        parse_url_components_abi_cxx11_
                  ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_b8,(aux *)plVar4[1].prev_,url_00,in_R8);
        ::std::__cxx11::string::operator=((string *)&hostname,(string *)(local_b8 + 0x28));
        ::std::
        _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b8);
        bVar3 = ::std::operator!=(&hostname,&udp_hostname);
        if (!bVar3) {
          plVar6 = plVar1->next_;
          plVar2 = plVar1->prev_;
          plVar2->next_ = plVar6;
          plVar6->prev_ = plVar2;
          (p->super_type).data_.root_plus_size_.super_size_traits.size_ =
               (p->super_type).data_.root_plus_size_.super_size_traits.size_ - 1;
          plVar1->next_ = (node_ptr)0x0;
          plVar1->prev_ = (node_ptr)0x0;
          local_108._8_8_ = plVar4;
          boost::intrusive::
          list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
          ::insert((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                    *)local_b8,(const_iterator *)p,(reference)(local_108 + 8));
          plVar1 = plVar4->next_;
          plVar2 = plVar4->prev_;
          plVar2->next_ = plVar1;
          plVar1->prev_ = plVar2;
          (p->super_type).data_.root_plus_size_.super_size_traits.size_ =
               (p->super_type).data_.root_plus_size_.super_size_traits.size_ - 1;
          plVar4->next_ = (node_ptr)0x0;
          plVar4->prev_ = (node_ptr)0x0;
          local_108._0_8_ = plVar6;
          boost::intrusive::
          list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
          ::insert((list_impl<boost::intrusive::mhtraits<libtorrent::aux::announce_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::announce_entry::list_hook>,_unsigned_long,_true,_void>
                    *)local_b8,(const_iterator *)p,(reference)local_108);
          ::std::__cxx11::string::~string((string *)&hostname);
          break;
        }
        ::std::__cxx11::string::~string((string *)&hostname);
      }
    }
    ::std::__cxx11::string::~string((string *)&udp_hostname);
  } while( true );
}

Assistant:

void tracker_list::prioritize_udp_trackers()
{
	INVARIANT_CHECK;

	// look for udp-trackers
	for (auto i = m_trackers.begin(), end(m_trackers.end()); i != end; ++i)
	{
		if (i->url.substr(0, 6) != "udp://") continue;
		// now, look for trackers with the same hostname
		// that is has higher priority than this one
		// if we find one, swap with the udp-tracker
		error_code ec;
		std::string udp_hostname;
		using std::ignore;
		std::tie(ignore, ignore, udp_hostname, ignore, ignore)
			= parse_url_components(i->url, ec);
		for (auto j = m_trackers.begin(); j != i; ++j)
		{
			if (j->url.substr(0, 6) == "udp://") continue;
			std::string hostname;
			std::tie(ignore, ignore, hostname, ignore, ignore)
				= parse_url_components(j->url, ec);
			if (hostname != udp_hostname) continue;
			auto* ae1 = &*i;
			auto* ae2 = &*j;
			i = m_trackers.erase(i);
			m_trackers.insert(j, *ae1);
			j = m_trackers.erase(j);
			m_trackers.insert(i, *ae2);
			break;
		}
	}
}